

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

int Gia_ManTerRetire(Gia_ManTer_t *p,uint *pThis,uint *pPrev)

{
  uint *pInfo;
  int iVar1;
  int iVar2;
  int local_24;
  int Entry;
  int i;
  uint *pPrev_local;
  uint *pThis_local;
  Gia_ManTer_t *p_local;
  
  Vec_IntClear(p->vRetired);
  for (local_24 = 0; iVar1 = Gia_ManRegNum(p->pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Gia_ManTerSimInfoGet(pThis,local_24);
    iVar2 = Gia_ManTerSimInfoGet(pPrev,local_24);
    if (iVar1 != iVar2) {
      Vec_IntPush(p->vRetired,local_24);
    }
  }
  for (local_24 = 0; iVar1 = Vec_IntSize(p->vRetired), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(p->vRetired,local_24);
    pInfo = p->pDataSimCis;
    iVar2 = Gia_ManPiNum(p->pAig);
    Gia_ManTerSimInfoSet(pInfo,iVar2 + iVar1,3);
  }
  iVar1 = Vec_IntSize(p->vRetired);
  return iVar1;
}

Assistant:

int Gia_ManTerRetire( Gia_ManTer_t * p, unsigned * pThis, unsigned * pPrev )
{
    int i, Entry;
    // find registers whose value has changed
    Vec_IntClear( p->vRetired );
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pThis, i ) != Gia_ManTerSimInfoGet( pPrev, i ) )
            Vec_IntPush( p->vRetired, i );
    // set all of them to zero
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}